

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

NetTypeDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NetTypeDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::DataTypeSyntax&,slang::parsing::Token&,slang::syntax::WithFunctionClauseSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,DataTypeSyntax *args_2,Token *args_3,WithFunctionClauseSyntax **args_4,
          Token *args_5)

{
  Token keyword;
  Token name;
  Token semi;
  NetTypeDeclarationSyntax *withFunction;
  undefined8 in_RCX;
  Info *in_RDX;
  Info *in_R8;
  undefined8 in_R9;
  undefined8 *in_stack_00000008;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  withFunction = (NetTypeDeclarationSyntax *)
                 allocate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                          in_stack_ffffffffffffff88);
  keyword.info = (Info *)in_RDX->rawTextPtr;
  keyword._0_8_ = in_R8->location;
  name.info = in_R8;
  name.kind = (short)in_R9;
  name._2_1_ = (char)((ulong)in_R9 >> 0x10);
  name.numFlags.raw = (char)((ulong)in_R9 >> 0x18);
  name.rawLen = (int)((ulong)in_R9 >> 0x20);
  semi.info = in_RDX;
  semi.kind = (short)in_RCX;
  semi._2_1_ = (char)((ulong)in_RCX >> 0x10);
  semi.numFlags.raw = (char)((ulong)in_RCX >> 0x18);
  semi.rawLen = (int)((ulong)in_RCX >> 0x20);
  slang::syntax::NetTypeDeclarationSyntax::NetTypeDeclarationSyntax
            ((NetTypeDeclarationSyntax *)in_R8->rawTextPtr,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_00000008[1],keyword,
             (DataTypeSyntax *)*in_stack_00000008,name,(WithFunctionClauseSyntax *)withFunction,semi
            );
  return withFunction;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }